

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPRequest::getp_getHeaders
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  TadsHttpRequestHeader *pTVar1;
  int iVar2;
  vm_obj_id_t obj;
  vm_httpreq_ext *pvVar3;
  CVmObject *keystr;
  size_t len;
  vm_val_t *in_RDX;
  CVmObjHTTPRequest *in_RDI;
  CVmObjLookupTable *tab;
  TadsHttpRequestHeader *hdrs;
  TadsHttpRequest *req;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  uint *in_stack_ffffffffffffff70;
  vm_val_t *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  int iVar4;
  char *str;
  vm_val_t *this_00;
  CVmObjLookupTable *tab_00;
  TadsHttpRequestHeader *local_48;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if ((getp_getHeaders(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_getHeaders(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getHeaders::desc,0);
    __cxa_guard_release(&getp_getHeaders(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (iVar2 == 0) {
    pvVar3 = get_ext(in_RDI);
    pTVar1 = pvVar3->req->hdr_list;
    this_00 = in_RDX;
    obj = CVmObjLookupTable::create
                    ((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(uint)in_stack_ffffffffffffff70
                     ,in_stack_ffffffffffffff6c);
    iVar2 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    vm_val_t::set_obj(this_00,obj);
    CVmStack::push(in_RDX);
    keystr = vm_objp(0);
    tab_00 = (CVmObjLookupTable *)pTVar1->name;
    strlen(pTVar1->name);
    add_parsed_val((CVmObjLookupTable *)this_00,iVar4,in_stack_ffffffffffffff80,
                   (size_t)in_stack_ffffffffffffff78,iVar2);
    for (local_48 = pTVar1->nxt; local_48 != (TadsHttpRequestHeader *)0x0; local_48 = local_48->nxt)
    {
      iVar4 = (int)((ulong)local_48->name >> 0x20);
      len = strlen(local_48->name);
      str = local_48->value;
      strlen(local_48->value);
      add_parsed_val(tab_00,(char *)keystr,(size_t)this_00,str,len,iVar4);
    }
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getHeaders(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;

    /* create a lookup table to hold the result; push it for gc protection */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 32, 64));
    G_stk->push(retval);
    CVmObjLookupTable *tab =
        (CVmObjLookupTable *)vm_objp(vmg_ retval->val.obj);

    /* 
     *   The first item in the list is the special "request line," with the
     *   HTTP verb and resource name; it's not really a header, as it doesn't
     *   have a name/value pair, so we file it under the key [1]. 
     */
    add_parsed_val(vmg_ tab, 1, hdrs->name, strlen(hdrs->name), ENCMODE_NONE);

    /* add the rest as key/value pairs */
    for (hdrs = hdrs->nxt ; hdrs != 0 ; hdrs = hdrs->nxt)
        add_parsed_val(vmg_ tab, hdrs->name, strlen(hdrs->name),
                       hdrs->value, strlen(hdrs->value), ENCMODE_NONE);

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}